

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_radixsort.h
# Opt level: O1

void gim_down_heap<GIM_RSORT_TOKEN,GIM_RSORT_TOKEN_COMPARATOR>(long pArr,uint k,uint n)

{
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  
  iVar1 = *(int *)(pArr + (ulong)(k - 1) * 8);
  uVar2 = *(undefined4 *)(pArr + 4 + (ulong)(k - 1) * 8);
  while (k <= n >> 1) {
    uVar3 = k * 2;
    if ((int)uVar3 < (int)n) {
      uVar3 = uVar3 | (uint)(*(int *)(pArr + -8 + (long)(int)uVar3 * 8) -
                            *(int *)(pArr + (long)(int)uVar3 * 8)) >> 0x1f;
    }
    if (-1 < iVar1 - *(int *)(pArr + -8 + (long)(int)uVar3 * 8)) break;
    *(undefined8 *)(pArr + (ulong)(k - 1) * 8) = *(undefined8 *)(pArr + -8 + (long)(int)uVar3 * 8);
    k = uVar3;
  }
  *(ulong *)(pArr + (ulong)(k - 1) * 8) = CONCAT44(uVar2,iVar1);
  return;
}

Assistant:

void gim_down_heap(T *pArr, GUINT k, GUINT n,COMP_CLASS CompareFunc)
{
	/*  PRE: a[k+1..N] is a heap */
	/* POST:  a[k..N]  is a heap */

	T temp = pArr[k - 1];
	/* k has child(s) */
	while (k <= n/2)
	{
		int child = 2*k;

		if ((child < (int)n) && CompareFunc(pArr[child - 1] , pArr[child])<0)
		{
			child++;
		}
		/* pick larger child */
		if (CompareFunc(temp , pArr[child - 1])<0)
		{
			/* move child up */
			pArr[k - 1] = pArr[child - 1];
			k = child;
		}
		else
		{
			break;
		}
	}
	pArr[k - 1] = temp;
}